

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_scope.c
# Opt level: O1

l2_scope_guid
l2_scope_create_scope(l2_scope_guid src,l2_scope_create_flag cf,l2_scope_type scope_type)

{
  l2_scope_guid p_Var1;
  _l2_scope *p_Var2;
  l2_scope_guid p_Var3;
  l2_symbol_node *plVar4;
  char *pcVar5;
  l2_internal_error_type error_type;
  _l2_scope **pp_Var6;
  
  if (cf == L2_SCOPE_CREATE_COORDINATE_SCOPE) {
    p_Var2 = src;
    if (src->upper_p == (_l2_scope *)0x0) {
      pcVar5 = anon_var_dwarf_387b;
      error_type = L2_INTERNAL_ERROR_ILLEGAL_OPERATION;
      goto LAB_0010428a;
    }
    do {
      p_Var3 = p_Var2;
      p_Var2 = p_Var3->coor_p;
    } while (p_Var3->coor_p != (_l2_scope *)0x0);
    p_Var2 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
    p_Var3->coor_p = p_Var2;
    p_Var2->guid = p_Var2;
    p_Var2->level = src->level;
    p_Var2->upper_p = src->upper_p;
  }
  else {
    if (cf != L2_SCOPE_CREATE_SUB_SCOPE) {
      pcVar5 = anon_var_dwarf_3899;
      error_type = L2_INTERNAL_ERROR_UNREACHABLE_CODE;
LAB_0010428a:
      l2_internal_error(error_type,pcVar5);
    }
    p_Var1 = src->lower_p;
    if (src->lower_p == (l2_scope_guid)0x0) {
      pp_Var6 = &src->lower_p;
      p_Var2 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
      src->lower_p = p_Var2;
      p_Var2->guid = p_Var2;
      p_Var2->level = src->level + 1;
      p_Var2->upper_p = src;
      p_Var2->lower_p = (_l2_scope *)0x0;
      p_Var2 = src->lower_p;
      goto LAB_00104213;
    }
    do {
      p_Var3 = p_Var1;
      p_Var1 = p_Var3->coor_p;
    } while (p_Var3->coor_p != (_l2_scope *)0x0);
    p_Var2 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
    p_Var3->coor_p = p_Var2;
    p_Var2->guid = p_Var2;
    p_Var2->level = src->level + 1;
    p_Var2->upper_p = src;
  }
  pp_Var6 = &p_Var3->coor_p;
  p_Var2->lower_p = (_l2_scope *)0x0;
LAB_00104213:
  p_Var2->scope_type = scope_type;
  plVar4 = l2_symbol_table_create();
  p_Var3 = *pp_Var6;
  p_Var3->symbol_table_p = plVar4;
  return p_Var3;
}

Assistant:

l2_scope_guid l2_scope_create_scope(l2_scope_guid src, l2_scope_create_flag cf, l2_scope_type scope_type) {
    l2_scope *scope_p = L2_NULL_PTR;
    switch(cf) {
        case L2_SCOPE_CREATE_SUB_SCOPE:
            if (src->lower_p) {
                scope_p = src->lower_p;
                while (scope_p->coor_p) scope_p = scope_p->coor_p;

                scope_p->coor_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
                scope_p->coor_p->guid = scope_p->coor_p;
                scope_p->coor_p->level = src->level + 1;
                scope_p->coor_p->upper_p = src;
                scope_p->coor_p->lower_p = L2_NULL_PTR;
                scope_p->coor_p->scope_type = scope_type;
                scope_p->coor_p->symbol_table_p = l2_symbol_table_create();
                return scope_p->coor_p;

            } else {
                src->lower_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
                src->lower_p->guid = src->lower_p;
                src->lower_p->level = src->level + 1;
                src->lower_p->upper_p = src;
                src->lower_p->lower_p = L2_NULL_PTR;
                src->lower_p->scope_type = scope_type;
                src->lower_p->symbol_table_p = l2_symbol_table_create();
                return src->lower_p;
            }

        case L2_SCOPE_CREATE_COORDINATE_SCOPE:
            if (!src->upper_p)
                l2_internal_error(L2_INTERNAL_ERROR_ILLEGAL_OPERATION, "无法在全局作用域邻近位置创建平行的作用域");

            scope_p = src;
            while (scope_p->coor_p) scope_p = scope_p->coor_p;

            scope_p->coor_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
            scope_p->coor_p->guid = scope_p->coor_p;
            scope_p->coor_p->level = src->level;
            scope_p->coor_p->upper_p = src->upper_p;
            scope_p->coor_p->lower_p = L2_NULL_PTR;
            scope_p->coor_p->scope_type = scope_type;
            scope_p->coor_p->symbol_table_p = l2_symbol_table_create();
            return scope_p->coor_p;

        default:
            l2_internal_error(L2_INTERNAL_ERROR_UNREACHABLE_CODE, "出现意外错误，运行至不可达的代码块");
    }
}